

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BasicReporter::EndTestCase
          (BasicReporter *this,TestCaseInfo *testInfo,Totals *totals,string *stdOut,string *stdErr)

{
  ostream *poVar1;
  string local_50;
  
  if (stdOut->_M_string_length != 0) {
    startSpansLazily(this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"stdout","");
    streamVariableLengthText(this,&local_50,stdOut);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (stdErr->_M_string_length != 0) {
    startSpansLazily(this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"stderr","");
    streamVariableLengthText(this,&local_50,stdErr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((this->m_testSpan).emitted == true) {
    poVar1 = (this->m_config).m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[Finished: \'",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(testInfo->name)._M_dataplus._M_p,(testInfo->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' ",2);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"All ","");
    ReportCounts(this,totals,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    poVar1 = (this->m_config).m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

virtual void EndTestCase(   const TestCaseInfo& testInfo,
                                    const Totals& totals,
                                    const std::string& stdOut,
                                    const std::string& stdErr ) {
            if( !stdOut.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stdout", stdOut );
            }

            if( !stdErr.empty() ) {
                startSpansLazily();
                streamVariableLengthText( "stderr", stdErr );
            }

            if( m_testSpan.emitted ) {
                m_config.stream() << "[Finished: '" << testInfo.name << "' ";
                ReportCounts( totals );
                m_config.stream() << "]" << std::endl;
            }
        }